

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.h
# Opt level: O1

bool Js::JavascriptNumber::IsInt32(double value)

{
  bool bVar1;
  
  if (((double)(int)value == value) && (!NAN((double)(int)value) && !NAN(value))) {
    bVar1 = NumberUtilities::IsSpecial(value,0x8000000000000000);
    return !bVar1;
  }
  return false;
}

Assistant:

static bool TryGetInt32Value(const double value, int32 *const int32Value)
        {
            Assert(int32Value);

            const int32 i = static_cast<int32>(value);
            if (static_cast<double>(i) != value || (!acceptNegZero && IsNegZero(value)))
            {
                return false;
            }

            *int32Value = i;
            return true;
        }